

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ratio.cpp
# Opt level: O0

void __thiscall
Ratio::setAllEEdges(Ratio *this,vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *edges)

{
  double *in_RDI;
  double dVar1;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *in_stack_00000088;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *in_stack_00000090;
  
  std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::operator=
            (in_stack_00000090,in_stack_00000088);
  dVar1 = geoAvg((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)this);
  *in_RDI = dVar1;
  return;
}

Assistant:

void Ratio::setAllEEdges(vector<PhyloTreeEdge>& edges) {
    eEdges = edges;
    eLength = geoAvg(eEdges);
}